

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void log_option(nh_option_desc *opt)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  __off_t _Var6;
  char *local_240;
  char *encbuf2;
  char *str;
  char encbuf [512];
  nh_option_desc *opt_local;
  
  if ((iflags.disable_log == '\0') && (logfile != -1)) {
    base64_encode(opt->name,(char *)&str);
    lprintf("\n!%s:",&str);
    switch(opt->type) {
    case OPTTYPE_BOOL:
      lprintf("b:%x",(ulong)((opt->value).b != '\0'));
      break;
    case OPTTYPE_INT:
      lprintf("i:%d",(ulong)(uint)(opt->value).i);
      break;
    case OPTTYPE_ENUM:
      lprintf("e:%x",(ulong)(uint)(opt->value).i);
      break;
    case OPTTYPE_STRING:
      if ((opt->value).s == (char *)0x0) {
        local_240 = "";
      }
      else {
        local_240 = (opt->value).s;
      }
      base64_encode(local_240,(char *)&str);
      lprintf("s:%s",&str);
      break;
    case OPTTYPE_AUTOPICKUP_RULES:
      pcVar3 = autopickup_to_string((opt->value).ar);
      lprintf("a:");
      sVar4 = strlen(pcVar3);
      iVar2 = base64size((int)sVar4);
      pcVar5 = (char *)malloc((long)iVar2);
      base64_encode(pcVar3,pcVar5);
      iVar2 = logfile;
      sVar4 = strlen(pcVar5);
      bVar1 = write_full(iVar2,pcVar5,sVar4);
      if (bVar1 == '\0') {
        panic("log_option: failed to write autopickup_rules");
      }
      free(pcVar5);
      free(pcVar3);
      break;
    case OPTTYPE_MSGTYPE:
      pcVar3 = msgtype_to_string((opt->value).mt);
      lprintf("m:");
      sVar4 = strlen(pcVar3);
      iVar2 = base64size((int)sVar4);
      pcVar5 = (char *)malloc((long)iVar2);
      base64_encode(pcVar3,pcVar5);
      iVar2 = logfile;
      sVar4 = strlen(pcVar5);
      bVar1 = write_full(iVar2,pcVar5,sVar4);
      if (bVar1 == '\0') {
        panic("log_option: failed to write msgtype_rules");
      }
      free(pcVar5);
      free(pcVar3);
    }
    _Var6 = lseek(logfile,0,1);
    last_cmd_pos = (uint)_Var6;
  }
  return;
}

Assistant:

void log_option(struct nh_option_desc *opt)
{
    char encbuf[ENCBUFSZ];
    char *str, *encbuf2;
    
    if (iflags.disable_log || logfile == -1)
	return;
    
    base64_encode(opt->name, encbuf);
    lprintf("\n!%s:", encbuf);
    
    switch (opt->type) {
	case OPTTYPE_STRING:
	    str = opt->value.s ? opt->value.s : "";
	    base64_encode(str, encbuf);
	    lprintf("s:%s", encbuf);
	    break;
	    
	case OPTTYPE_ENUM:
	    lprintf("e:%x", opt->value.e);
	    break;
	    
	case OPTTYPE_INT:
	    lprintf("i:%d", opt->value.i);
	    break;
	    
	case OPTTYPE_BOOL:
	    lprintf("b:%x", !!opt->value.b);
	    break;
	
	case OPTTYPE_AUTOPICKUP_RULES:
	    str = autopickup_to_string(opt->value.ar);
	    lprintf("a:");
	    encbuf2 = malloc(base64size(strlen(str)));
	    base64_encode(str, encbuf2);
	    /* write directly, large numbers of rules might overflow outbuf in lprintf */
	    if (!write_full(logfile, encbuf2, strlen(encbuf2)))
		panic("log_option: failed to write autopickup_rules");
	    free(encbuf2);
	    free(str);
	    break;
	    
	case OPTTYPE_MSGTYPE:
	    str = msgtype_to_string(opt->value.mt);
	    lprintf("m:");
	    encbuf2 = malloc(base64size(strlen(str)));
	    base64_encode(str, encbuf2);
	    /* write directly, large numbers of rules may overflow outbuf in lprintf */
	    if (!write_full(logfile, encbuf2, strlen(encbuf2)))
		panic("log_option: failed to write msgtype_rules");
	    free(encbuf2);
	    free(str);
	    break;
    }
    
    last_cmd_pos = lseek(logfile, 0, SEEK_CUR);
}